

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O3

void __thiscall OpenMD::ElementsTable::Init(ElementsTable *this)

{
  pointer pcVar1;
  bool bVar2;
  char *__s;
  ifstrstream *this_00;
  long *plVar3;
  long *plVar4;
  int __fd;
  char *pcVar5;
  string filename_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char charBuffer [32768];
  char *local_8098;
  undefined8 local_8090;
  undefined7 local_8088;
  undefined4 uStack_8081;
  undefined1 local_807d;
  long *local_8078 [2];
  long local_8068 [2];
  long *local_8058;
  long local_8050;
  long local_8048;
  long lStack_8040;
  char local_8038 [32776];
  
  if (this->init_ == false) {
    this->init_ = true;
    __s = getenv("FORCE_PARAM_PATH");
    pcVar5 = (char *)(this->dir_)._M_string_length;
    if (__s == (char *)0x0) {
      __s = "/usr/local/openmd/forceFields";
    }
    else {
      strlen(__s);
    }
    std::__cxx11::string::_M_replace((ulong)&this->dir_,0,pcVar5,(ulong)__s);
    local_8088 = 0x746e656d656c65;
    uStack_8081 = 0x7478742e;
    local_8090 = 0xb;
    local_807d = 0;
    local_8098 = (char *)&local_8088;
    this_00 = (ifstrstream *)operator_new(0x278);
    ifstrstream::ifstrstream(this_00);
    pcVar5 = local_8098;
    ifstrstream::open(this_00,local_8098,8,0);
    __fd = (int)pcVar5;
    bVar2 = ifstrstream::is_open(this_00);
    if (!bVar2) {
      pcVar1 = (this->dir_)._M_dataplus._M_p;
      local_8078[0] = local_8068;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_8078,pcVar1,pcVar1 + (this->dir_)._M_string_length);
      std::__cxx11::string::append((char *)local_8078);
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_8078,(ulong)local_8098);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_8048 = *plVar4;
        lStack_8040 = plVar3[3];
        local_8058 = &local_8048;
      }
      else {
        local_8048 = *plVar4;
        local_8058 = (long *)*plVar3;
      }
      local_8050 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_8098,(string *)&local_8058);
      if (local_8058 != &local_8048) {
        operator_delete(local_8058,local_8048 + 1);
      }
      if (local_8078[0] != local_8068) {
        operator_delete(local_8078[0],local_8068[0] + 1);
      }
      pcVar5 = local_8098;
      ifstrstream::open(this_00,local_8098,8,0);
      __fd = (int)pcVar5;
      bVar2 = ifstrstream::is_open(this_00);
      if (!bVar2) {
        __fd = 2000;
        snprintf(painCave.errMsg,2000,
                 "Error opening the ElementsTable file:\n\t%s\n\tHave you tried setting the FORCE_PARAM_PATH environment variable?\n"
                 ,local_8098);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
    }
    bVar2 = ifstrstream::is_open(this_00);
    if (bVar2) {
      while( true ) {
        std::ios::widen((char)(this_00->super_basic_istream<char,_std::char_traits<char>_>).
                              _vptr_basic_istream[-3] + (char)this_00);
        pcVar5 = local_8038;
        plVar3 = (long *)std::istream::getline((char *)this_00,(long)local_8038,'\0');
        __fd = (int)pcVar5;
        if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
        ParseLine(this,local_8038);
      }
    }
    bVar2 = ifstrstream::is_open(this_00);
    if (bVar2) {
      ifstrstream::close(this_00,__fd);
    }
    if (this->init_ == false) {
      Init(this);
    }
    if ((int)((ulong)((long)(this->elements_).
                            super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->elements_).
                           super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) {
      snprintf(painCave.errMsg,2000,"ElementsTable error.\n\tCannot initialize database %s \n",
               local_8098);
      painCave._2000_8_ = painCave._2000_8_ & 0xffffffff00000000;
      simError();
    }
    if (local_8098 != (char *)&local_8088) {
      operator_delete(local_8098,CONCAT17((undefined1)uStack_8081,local_8088) + 1);
    }
  }
  return;
}

Assistant:

void ElementsTable::Init() {
    if (init_) return;
    init_ = true;

    char* tempPath;
    char charBuffer[BUFF_SIZE];
    tempPath = getenv("FORCE_PARAM_PATH");

    if (tempPath == NULL) {
      // convert a macro from compiler to a string in c++
      STR_DEFINE(dir_, FRC_PATH);
    } else {
      dir_ = tempPath;
    }

    std::string filename_("element.txt");

    ifstrstream* efStream = new ifstrstream();

    // Try to open the elements file in current directory first
    efStream->open(filename_.c_str());

    if (!efStream->is_open()) {
      // If current directory does not contain the elements file,
      // try to open it in ffPath_:
      filename_ = dir_ + FILE_SEP_CHAR + filename_;
      efStream->open(filename_.c_str());

      if (!efStream->is_open()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Error opening the ElementsTable file:\n"
                 "\t%s\n"
                 "\tHave you tried setting the FORCE_PARAM_PATH environment "
                 "variable?\n",
                 filename_.c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }

    if (efStream->is_open()) {
      while (efStream->getline(charBuffer, BUFF_SIZE))
        ParseLine(charBuffer);
    }

    if (efStream->is_open()) efStream->close();

    if (GetSize() == 0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ElementsTable error.\n"
               "\tCannot initialize database %s \n",
               filename_.c_str());
      painCave.isFatal = 0;
      simError();
    }
  }